

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall GlobalSimpleStringMemoryAccountant::stop(GlobalSimpleStringMemoryAccountant *this)

{
  UtestShell *pUVar1;
  TestMemoryAllocator *pTVar2;
  long *in_RDI;
  UtestShell *in_stack_ffffffffffffffb0;
  undefined8 local_28 [3];
  undefined8 local_10 [2];
  
  if (*in_RDI == 0) {
    pUVar1 = UtestShell::getCurrent();
    local_10[0] = 0;
    NormalTestTerminator::NormalTestTerminator((NormalTestTerminator *)in_stack_ffffffffffffffb0);
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,"Global SimpleString allocator stopped without starting",
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O0/CMake/cpputest/cpputest-src/src/CppUTest/SimpleString.cpp"
               ,0x57,local_10);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x170692);
  }
  pTVar2 = SimpleString::getStringAllocator();
  if (pTVar2 != (TestMemoryAllocator *)*in_RDI) {
    in_stack_ffffffffffffffb0 = UtestShell::getCurrent();
    local_28[0] = 0;
    NormalTestTerminator::NormalTestTerminator((NormalTestTerminator *)in_stack_ffffffffffffffb0);
    (*in_stack_ffffffffffffffb0->_vptr_UtestShell[0x1a])
              (in_stack_ffffffffffffffb0,
               "GlobalStrimpleStringMemoryAccountant: allocator has changed between start and stop!"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O0/CMake/cpputest/cpputest-src/src/CppUTest/SimpleString.cpp"
               ,0x5a,local_28);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x170719);
  }
  restoreAllocator((GlobalSimpleStringMemoryAccountant *)in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void GlobalSimpleStringMemoryAccountant::stop()
{
    if (allocator_ == NULLPTR)
        FAIL("Global SimpleString allocator stopped without starting");

    if (SimpleString::getStringAllocator() != allocator_)
      FAIL("GlobalStrimpleStringMemoryAccountant: allocator has changed between start and stop!");

    restoreAllocator();
}